

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O1

AnalyzedReferences * __thiscall
jaegertracing::Tracer::analyzeReferences
          (AnalyzedReferences *__return_storage_ptr__,Tracer *this,
          vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
          *references)

{
  Type TVar1;
  Type *pTVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  element_type *peVar5;
  bool bVar6;
  SpanContext *pSVar7;
  SpanContext *ctx;
  Type *pTVar8;
  bool bVar9;
  SpanContext *local_110;
  Reference local_e8;
  
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_parent = (SpanContext *)0x0;
  __return_storage_ptr__->_self = (SpanContext *)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = *(Type **)references;
  pTVar2 = *(Type **)(references + 8);
  if (pTVar8 == pTVar2) {
    local_110 = (SpanContext *)0x0;
    bVar9 = false;
  }
  else {
    local_110 = (SpanContext *)0x0;
    bVar6 = false;
    do {
      if (*(undefined8 *)(pTVar8 + 2) == 0) {
        ctx = (SpanContext *)0x0;
      }
      else {
        ctx = (SpanContext *)
              __dynamic_cast(*(undefined8 *)(pTVar8 + 2),&opentracing::v3::SpanContext::typeinfo,
                             &SpanContext::typeinfo,0);
      }
      pSVar7 = local_110;
      bVar9 = bVar6;
      if (ctx == (SpanContext *)0x0) {
        peVar5 = (this->_logger).
                 super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_e8._spanContext.super_SpanContext._vptr_SpanContext =
             (_func_int **)&local_e8._spanContext._traceID._low;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Reference contains invalid type of SpanReference","");
        (*peVar5->_vptr_Logger[2])(peVar5,&local_e8);
        if (local_e8._spanContext.super_SpanContext._vptr_SpanContext !=
            (_func_int **)&local_e8._spanContext._traceID._low) {
          operator_delete(local_e8._spanContext.super_SpanContext._vptr_SpanContext);
        }
      }
      else {
        uVar3 = (ctx->_traceID)._high;
        uVar4 = (ctx->_traceID)._low;
        if ((((uVar3 != 0 || uVar4 != 0) && (ctx->_spanID != 0)) ||
            ((uVar3 == 0 && ((uVar4 == 0 && ((ctx->_debugID)._M_string_length != 0)))))) ||
           ((ctx->_baggage)._M_h._M_element_count != 0)) {
          if (*pTVar8 == 99) {
            __return_storage_ptr__->_self = ctx;
          }
          else {
            TVar1 = *pTVar8;
            SpanContext::SpanContext(&local_e8._spanContext,ctx);
            local_e8._type = TVar1;
            std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::
            emplace_back<jaegertracing::Reference>(&__return_storage_ptr__->_references,&local_e8);
            local_e8._spanContext.super_SpanContext._vptr_SpanContext =
                 (_func_int **)&PTR__SpanContext_00266878;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._spanContext._debugID._M_dataplus._M_p !=
                &local_e8._spanContext._debugID.field_2) {
              operator_delete(local_e8._spanContext._debugID._M_dataplus._M_p);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_e8._spanContext._baggage._M_h);
            bVar9 = *pTVar8 == ChildOfRef;
            pSVar7 = ctx;
            if (bVar6) {
              pSVar7 = local_110;
              bVar9 = bVar6;
            }
          }
        }
      }
      local_110 = pSVar7;
      pTVar8 = pTVar8 + 4;
      bVar6 = bVar9;
    } while (pTVar8 != pTVar2);
  }
  if ((!bVar9) && (local_110 != (SpanContext *)0x0)) {
    bVar9 = ((local_110->_traceID)._low != 0 || (local_110->_traceID)._high != 0) &&
            local_110->_spanID != 0;
  }
  if (bVar9) {
    if (local_110 == (SpanContext *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Tracer.cpp"
                    ,0xef,
                    "Tracer::AnalyzedReferences jaegertracing::Tracer::analyzeReferences(const std::vector<OpenTracingRef> &) const"
                   );
    }
    __return_storage_ptr__->_parent = local_110;
  }
  return __return_storage_ptr__;
}

Assistant:

Tracer::AnalyzedReferences
Tracer::analyzeReferences(const std::vector<OpenTracingRef>& references) const
{
    AnalyzedReferences result;
    auto hasParent = false;
    const auto* parent = result._parent;
    for (auto&& ref : references) {
        const auto* ctx = dynamic_cast<const SpanContext*>(ref.second);

        if (!ctx) {
            _logger->error("Reference contains invalid type of SpanReference");
            continue;
        }

        if (!ctx->isValid() && !ctx->isDebugIDContainerOnly() &&
            ctx->baggage().empty()) {
            continue;
        }

        if (static_cast<int>(ref.first) == SpanReferenceType_JaegerSpecific_SelfRef)
        {
            result._self = ctx;
            continue; // not a reference
        }

        result._references.emplace_back(Reference(*ctx, ref.first));

        if (!hasParent) {
            parent = ctx;
            hasParent =
                (ref.first == opentracing::SpanReferenceType::ChildOfRef);
        }
    }

    if (!hasParent && parent && parent->isValid()) {
        // Use `FollowsFromRef` in place of `ChildOfRef`.
        hasParent = true;
    }

    if (hasParent) {
        assert(parent);
        result._parent = parent;
    }

    return result;
}